

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O1

void __thiscall QFontComboBoxPrivate::updateModel(QFontComboBoxPrivate *this)

{
  QFont *this_00;
  uint uVar1;
  undefined4 uVar2;
  QObject *this_01;
  QAbstractItemView *pQVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  QArrayData *pQVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  QList_conflict *pQVar12;
  QAbstractItemView *this_02;
  int index;
  long lVar13;
  QString *family;
  QString *args;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  QFontInfo fi;
  QAccessibleTableModelChangeEvent accessibleEvent;
  QArrayData *local_118;
  char16_t *pcStack_110;
  qsizetype local_108;
  QStringBuilder<QString,_QLatin1String> local_f8;
  QString local_c8;
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  qsizetype local_98;
  QArrayDataPointer<QString> local_88;
  undefined1 local_68 [16];
  QAbstractItemView *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QObject **)&(this->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  cVar9 = QCoreApplication::closingDown();
  if (cVar9 == '\0') {
    QComboBox::model((QComboBox *)this_01);
    pQVar12 = (QList_conflict *)QMetaObject::cast((QObject *)&QStringListModel::staticMetaObject);
    if (pQVar12 != (QList_conflict *)0x0) {
      this_02 = (QAbstractItemView *)QComboBox::view((QComboBox *)this_01);
      QAbstractItemView::itemDelegate(this_02);
      QMetaObject::cast((QObject *)&QFontFamilyDelegate::staticMetaObject);
      index = 0;
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QFontDatabase::families((WritingSystem)&local_88);
      local_a8 = (undefined1  [16])0x0;
      local_98 = 0;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = &this->currentFont;
      QFontInfo::QFontInfo((QFontInfo *)&local_b0,this_00);
      if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
        lVar13 = local_88.size * 0x18;
        index = 0;
        args = local_88.ptr;
        do {
          qVar8 = local_108;
          pcVar7 = pcStack_110;
          pQVar6 = local_118;
          cVar9 = QFontDatabase::isPrivateFamily((QString *)args);
          if (cVar9 == '\0') {
            uVar1 = (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                    super_QFlagsStorage<QFontComboBox::FontFilter>.i;
            uVar11 = uVar1 & 3;
            if ((uVar11 != 0) && (uVar11 != 3)) {
              local_68 = (undefined1  [16])0x0;
              local_58 = (QAbstractItemView *)0x0;
              cVar9 = QFontDatabase::isSmoothlyScalable((QString *)args,(QString *)local_68);
              if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                }
              }
              if (((uVar1 & 1) == 0) == (bool)cVar9) goto LAB_0040e14e;
            }
            uVar1 = (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                    super_QFlagsStorage<QFontComboBox::FontFilter>.i;
            uVar11 = uVar1 & 0xc;
            if ((uVar11 != 0) && (uVar11 != 0xc)) {
              local_68 = (undefined1  [16])0x0;
              local_58 = (QAbstractItemView *)0x0;
              cVar9 = QFontDatabase::isFixedPitch((QString *)args,(QString *)local_68);
              if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                }
              }
              if (((uVar1 & 4) == 0) == (bool)cVar9) goto LAB_0040e14e;
            }
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)local_a8,local_98,args);
            QList<QString>::end((QList<QString> *)local_a8);
            QFontInfo::family();
            pQVar3 = (QAbstractItemView *)(args->d).size;
            if (pQVar3 == local_58) {
              QVar14.m_data = (args->d).ptr;
              QVar14.m_size = (qsizetype)pQVar3;
              QVar15.m_data = (storage_type_conflict *)local_68._8_8_;
              QVar15.m_size = (qsizetype)local_58;
              cVar9 = QtPrivate::equalStrings(QVar14,QVar15);
            }
            else {
              cVar9 = '\0';
            }
            cVar10 = '\x01';
            if (cVar9 == '\0') {
              QFontInfo::family();
              local_118 = (QArrayData *)0x0;
              pcStack_110 = (char16_t *)0x0;
              local_f8.a.d.d = (Data *)pQVar6;
              local_f8.a.d.ptr = pcVar7;
              local_108 = 0;
              local_f8.a.d.size = qVar8;
              local_f8.b.m_size = 2;
              local_f8.b.m_data = " [";
              QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_c8,&local_f8);
              cVar10 = QString::startsWith((QString *)args,(CaseSensitivity)&local_c8);
              if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                     _M_i + -1;
                UNLOCK();
                if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
              }
            }
            if (cVar10 != '\0') {
              index = (int)local_98 + -1;
            }
          }
LAB_0040e14e:
          args = args + 1;
          lVar13 = lVar13 + -0x18;
        } while (lVar13 != 0);
      }
      QObject::blockSignals(SUB81(pQVar12,0));
      QStringListModel::setStringList(pQVar12);
      cVar9 = QAccessible::isActive();
      if (cVar9 != '\0') {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = (QAbstractItemView *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = QComboBox::view((QComboBox *)this_01);
        puStack_50 = (undefined1 *)0xffffffff;
        local_48 = (undefined1 *)0xffffffffffffffff;
        puStack_40 = (undefined1 *)0xffffffffffffffff;
        local_68._8_4_ = 0x116;
        local_68._0_8_ = QIcon::QIcon;
        QAccessible::updateAccessibility((QAccessibleEvent *)local_68);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)local_68);
      }
      QObject::blockSignals(SUB81(pQVar12,0));
      if (local_98 == 0) {
        QFont::QFont((QFont *)local_68);
        cVar9 = QFont::operator!=(this_00,(QFont *)local_68);
        QFont::~QFont((QFont *)local_68);
        if (cVar9 != '\0') {
          QFont::QFont((QFont *)local_68);
          uVar4 = *(undefined8 *)&this->currentFont;
          *(undefined8 *)&this->currentFont = local_68._0_8_;
          uVar2 = *(undefined4 *)&this->field_0x360;
          *(undefined4 *)&this->field_0x360 = local_68._8_4_;
          local_68._8_4_ = uVar2;
          local_68._0_8_ = uVar4;
          QFont::~QFont((QFont *)local_68);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = this_00;
          local_68 = auVar5 << 0x40;
          QMetaObject::activate(this_01,&QFontComboBox::staticMetaObject,0,(void **)local_68);
        }
      }
      else {
        QComboBox::setCurrentIndex((QComboBox *)this_01,index);
      }
      QFontInfo::~QFontInfo((QFontInfo *)&local_b0);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_a8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBoxPrivate::updateModel()
{
    Q_Q(QFontComboBox);

    if (QCoreApplication::closingDown())
        return;

    const int scalableMask = (QFontComboBox::ScalableFonts | QFontComboBox::NonScalableFonts);
    const int spacingMask = (QFontComboBox::ProportionalFonts | QFontComboBox::MonospacedFonts);

    QStringListModel *m = qobject_cast<QStringListModel *>(q->model());
    if (!m)
        return;
    QFontFamilyDelegate *delegate = qobject_cast<QFontFamilyDelegate *>(q->view()->itemDelegate());
    QFontDatabase::WritingSystem system = delegate ? delegate->writingSystem : QFontDatabase::Any;

    const QStringList list = QFontDatabase::families(system);
    QStringList result;

    int offset = 0;
    QFontInfo fi(currentFont);

    for (const auto &family : list) {
        if (QFontDatabase::isPrivateFamily(family))
            continue;

        if ((filters & scalableMask) && (filters & scalableMask) != scalableMask) {
            if (bool(filters & QFontComboBox::ScalableFonts) != QFontDatabase::isSmoothlyScalable(family))
                continue;
        }
        if ((filters & spacingMask) && (filters & spacingMask) != spacingMask) {
            if (bool(filters & QFontComboBox::MonospacedFonts) != QFontDatabase::isFixedPitch(family))
                continue;
        }
        result += family;
        if (family == fi.family() || family.startsWith(fi.family() + " ["_L1))
            offset = result.size() - 1;
    }

    //we need to block the signals so that the model doesn't emit reset
    //this prevents the current index from changing
    //it will be updated just after this
    ///TODO: we should finda way to avoid blocking signals and have a real update of the model
    {
        const QSignalBlocker blocker(m);
        m->setStringList(result);
        // Since the modelReset signal is blocked the view will not emit an accessibility event
    #if QT_CONFIG(accessibility)
        if (QAccessible::isActive()) {
            QAccessibleTableModelChangeEvent accessibleEvent(q->view(), QAccessibleTableModelChangeEvent::ModelReset);
            QAccessible::updateAccessibility(&accessibleEvent);
        }
    #endif
    }

    if (result.isEmpty()) {
        if (currentFont != QFont()) {
            currentFont = QFont();
            emit q->currentFontChanged(currentFont);
        }
    } else {
        q->setCurrentIndex(offset);
    }
}